

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::ConfigBlockSymbol::checkUnusedRules(ConfigBlockSymbol *this)

{
  Scope *scope;
  ConfigRule *rule;
  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
  *this_00;
  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
  *this_01;
  flat_hash_map<const_SourceLibrary_*,_ConfigRule_*> *__range3;
  table_element_pointer ppVar1;
  const_iterator __begin3;
  const_iterator __begin2;
  
  this_00 = &getCellOverrides(this)->table_;
  __begin2 = (const_iterator)
             boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
             ::begin(this_00);
  scope = &this->super_Scope;
  ppVar1 = __begin2.p_;
  while (ppVar1 != (table_element_pointer)0x0) {
    rule = (ppVar1->second).defaultRule;
    if (rule != (ConfigRule *)0x0) {
      checkRuleUnused(scope,rule,true);
    }
    __begin3 = (const_iterator)
               boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
               ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_slang::hash<const_slang::SourceLibrary_*,_void>,_std::equal_to<const_slang::SourceLibrary_*>,_std::allocator<std::pair<const_slang::SourceLibrary_*const,_slang::ast::ConfigRule_*>_>_>
                        *)&ppVar1->second);
    while (__begin3.p_ != (table_element_pointer)0x0) {
      checkRuleUnused(scope,(__begin3.p_)->second,true);
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::SourceLibrary_*,_slang::ast::ConfigRule_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::increment(&__begin3);
    }
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::CellOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::increment(&__begin2);
    ppVar1 = __begin2.p_;
  }
  this_01 = &getInstanceOverrides(this)->table_;
  __begin2 = (const_iterator)
             boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
             ::begin(this_01);
  while ((table_element_pointer)__begin2.p_ != (table_element_pointer)0x0) {
    checkNodeUnused(scope,&((table_element_pointer)__begin2.p_)->second);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 *)&__begin2);
  }
  return;
}

Assistant:

void ConfigBlockSymbol::checkUnusedRules() const {
    for (auto& [_, cellOverride] : getCellOverrides()) {
        if (cellOverride.defaultRule)
            checkRuleUnused(*this, *cellOverride.defaultRule, true);

        for (auto& [lib, rule] : cellOverride.specificLibRules)
            checkRuleUnused(*this, *rule, true);
    }

    for (auto& [_, instOverride] : getInstanceOverrides())
        checkNodeUnused(*this, instOverride);
}